

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O1

int glfwGetInputMode(GLFWwindow *handle,int mode)

{
  int iVar1;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/glfw/src/input.c"
                  ,0x1d0,"int glfwGetInputMode(GLFWwindow *, int)");
  }
  if (_glfw.initialized == 0) {
    iVar1 = 0;
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    switch(mode) {
    case 0x33001:
      iVar1 = *(int *)(handle + 0x74);
      break;
    case 0x33002:
      iVar1 = *(int *)(handle + 0x68);
      break;
    case 0x33003:
      iVar1 = *(int *)(handle + 0x6c);
      break;
    case 0x33004:
      iVar1 = *(int *)(handle + 0x70);
      break;
    default:
      iVar1 = 0;
      _glfwInputError(0x10003,"Invalid input mode 0x%08X");
    }
  }
  return iVar1;
}

Assistant:

GLFWAPI int glfwGetInputMode(GLFWwindow* handle, int mode)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(0);

    switch (mode)
    {
        case GLFW_CURSOR:
            return window->cursorMode;
        case GLFW_STICKY_KEYS:
            return window->stickyKeys;
        case GLFW_STICKY_MOUSE_BUTTONS:
            return window->stickyMouseButtons;
        case GLFW_LOCK_KEY_MODS:
            return window->lockKeyMods;
    }

    _glfwInputError(GLFW_INVALID_ENUM, "Invalid input mode 0x%08X", mode);
    return 0;
}